

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_helpers.cc
# Opt level: O0

void bssl::VerifyCertErrors
               (string *expected_errors_str,CertErrors *actual_errors,string *errors_file_path)

{
  bool bVar1;
  Message *pMVar2;
  AssertHelper local_60 [3];
  Message local_48;
  undefined1 local_40 [8];
  string actual_errors_str;
  string *errors_file_path_local;
  CertErrors *actual_errors_local;
  string *expected_errors_str_local;
  
  actual_errors_str.field_2._8_8_ = errors_file_path;
  CertErrors::ToDebugString_abi_cxx11_((string *)local_40,actual_errors);
  bVar1 = ::std::operator!=(expected_errors_str,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40);
  if (bVar1) {
    testing::Message::Message(&local_48);
    pMVar2 = testing::Message::operator<<
                       (&local_48,(char (*) [39])"Cert errors don\'t match expectations (");
    pMVar2 = testing::Message::operator<<
                       (pMVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               actual_errors_str.field_2._8_8_);
    pMVar2 = testing::Message::operator<<(pMVar2,(char (*) [4])0x739f86);
    pMVar2 = testing::Message::operator<<(pMVar2,(char (*) [12])"EXPECTED:\n\n");
    pMVar2 = testing::Message::operator<<(pMVar2,expected_errors_str);
    pMVar2 = testing::Message::operator<<(pMVar2,(char (*) [2])0x739f88);
    pMVar2 = testing::Message::operator<<(pMVar2,(char (*) [10])"ACTUAL:\n\n");
    pMVar2 = testing::Message::operator<<
                       (pMVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_40);
    pMVar2 = testing::Message::operator<<(pMVar2,(char (*) [2])0x739f88);
    pMVar2 = testing::Message::operator<<
                       (pMVar2,(char (*) [82])
                               "===> Use pki/testdata/parse_certificate_unittest/rebase-errors.py to rebaseline.\n"
                       );
    testing::internal::AssertHelper::AssertHelper
              (local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/test_helpers.cc"
               ,0x1d6,"Failed");
    testing::internal::AssertHelper::operator=(local_60,pMVar2);
    testing::internal::AssertHelper::~AssertHelper(local_60);
    testing::Message::~Message(&local_48);
  }
  ::std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void VerifyCertErrors(const std::string &expected_errors_str,
                      const CertErrors &actual_errors,
                      const std::string &errors_file_path) {
  std::string actual_errors_str = actual_errors.ToDebugString();

  if (expected_errors_str != actual_errors_str) {
    ADD_FAILURE() << "Cert errors don't match expectations ("
                  << errors_file_path << ")\n\n"
                  << "EXPECTED:\n\n"
                  << expected_errors_str << "\n"
                  << "ACTUAL:\n\n"
                  << actual_errors_str << "\n"
                  << "===> Use "
                     "pki/testdata/parse_certificate_unittest/"
                     "rebase-errors.py to rebaseline.\n";
  }
}